

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O2

String * __thiscall
glcts::LayoutBindingBaseCase::buildArrayAccess_abi_cxx11_
          (String *__return_storage_ptr__,LayoutBindingBaseCase *this,int uniform,int idx)

{
  ostream *poVar1;
  StringStream s;
  string local_1e0 [8];
  long local_1d8;
  string local_1c0 [32];
  StringStream local_1a0;
  
  StringStream::StringStream(&local_1a0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (local_1e0,this,(ulong)(uint)uniform);
  poVar1 = std::operator<<((ostream *)&local_1a0,local_1e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1e])
            (local_1c0,this,(ulong)(uint)idx);
  std::operator<<(poVar1,local_1c0);
  std::__cxx11::string::~string(local_1c0);
  std::__cxx11::string::~string(local_1e0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])(local_1c0,this,0);
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x1c])
            (local_1e0,this,local_1c0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1c0);
  if (local_1d8 != 0) {
    poVar1 = std::operator<<((ostream *)&local_1a0,".");
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
              (local_1e0,this,(ulong)(uint)uniform);
    std::operator<<(poVar1,local_1e0);
    std::__cxx11::string::~string(local_1e0);
  }
  std::__cxx11::stringbuf::str();
  StringStream::~StringStream(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

virtual String buildArrayAccess(int uniform, int idx)
	{
		StringStream s;
		s << getDefaultUniformName(uniform) << buildArray(idx);
		if (!buildBlockName(getDefaultUniformName()).empty())
		{
			s << "." << getDefaultUniformName(uniform);
		}
		return s.str();
	}